

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjToString(jx9_value *pObj)

{
  sxi32 local_14;
  sxi32 rc;
  jx9_value *pObj_local;
  
  local_14 = 0;
  if ((pObj->iFlags & 1U) == 0) {
    SyBlobReset(&pObj->sBlob);
    local_14 = MemObjStringValue(&pObj->sBlob,pObj);
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 1;
  }
  return local_14;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToString(jx9_value *pObj)
{
	sxi32 rc = SXRET_OK;
	if( (pObj->iFlags & MEMOBJ_STRING) == 0 ){
		/* Perform the conversion */
		SyBlobReset(&pObj->sBlob); /* Reset the internal buffer */
		rc = MemObjStringValue(&pObj->sBlob, &(*pObj));
		MemObjSetType(pObj, MEMOBJ_STRING);
	}
	return rc;
}